

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

FieldDescriptor * __thiscall
google::protobuf::FileDescriptorTables::FindFieldByCamelcaseName
          (FileDescriptorTables *this,void *parent,string *camelcase_name)

{
  first_type *key;
  unordered_map<std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>_>
  *collection;
  second_type pFVar1;
  _func_void_FileDescriptorTables_ptr *in_RDI;
  once_flag *in_stack_ffffffffffffffc0;
  pair<const_void_*,_const_char_*> local_30 [2];
  void *local_10 [2];
  
  internal::
  call_once<std::once_flag&,void(&)(google::protobuf::FileDescriptorTables_const*),google::protobuf::FileDescriptorTables_const*>
            (in_stack_ffffffffffffffc0,in_RDI,(FileDescriptorTables **)0x4be05c);
  key = (first_type *)(in_RDI + 0x80);
  collection = (unordered_map<std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>_>
                *)std::__cxx11::string::c_str();
  std::pair<const_void_*,_const_char_*>::pair<const_void_*&,_const_char_*,_true>
            (local_30,local_10,(char **)&stack0xffffffffffffffc8);
  pFVar1 = FindPtrOrNull<std::unordered_map<std::pair<void_const*,char_const*>,google::protobuf::FieldDescriptor_const*,google::protobuf::(anonymous_namespace)::PointerStringPairHash,google::protobuf::(anonymous_namespace)::PointerStringPairEqual,std::allocator<std::pair<std::pair<void_const*,char_const*>const,google::protobuf::FieldDescriptor_const*>>>>
                     (collection,key);
  return pFVar1;
}

Assistant:

inline const FieldDescriptor* FileDescriptorTables::FindFieldByCamelcaseName(
    const void* parent, const std::string& camelcase_name) const {
  internal::call_once(
      fields_by_camelcase_name_once_,
      FileDescriptorTables::FieldsByCamelcaseNamesLazyInitStatic, this);
  return FindPtrOrNull(fields_by_camelcase_name_,
                            PointerStringPair(parent, camelcase_name.c_str()));
}